

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 07_result.cc
# Opt level: O0

result<Foo,_ErrorMsg> * __thiscall
Foo::create_abi_cxx11_(result<Foo,_ErrorMsg> *__return_storage_ptr__,Foo *this,int n)

{
  Foo local_50 [5];
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_14;
  result<Foo,_ErrorMsg> *prStack_10;
  int n_local;
  
  local_14 = (int)this;
  prStack_10 = __return_storage_ptr__;
  if (local_14 < 0x15) {
    Foo(local_50,local_14);
    ezy::
    strong_type<std::variant<Foo,std::__cxx11::string>,void,ezy::features::visitable,ezy::features::result_like_continuation>
    ::strong_type_payload<Foo>
              ((strong_type<std::variant<Foo,std::__cxx11::string>,void,ezy::features::visitable,ezy::features::result_like_continuation>
                *)__return_storage_ptr__,local_50);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Too big!",&local_39);
    ezy::
    strong_type<std::variant<Foo,std::__cxx11::string>,void,ezy::features::visitable,ezy::features::result_like_continuation>
    ::strong_type_payload<std::__cxx11::string>
              ((strong_type<std::variant<Foo,std::__cxx11::string>,void,ezy::features::visitable,ezy::features::result_like_continuation>
                *)__return_storage_ptr__,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  return __return_storage_ptr__;
}

Assistant:

static ezy::result<Foo, ErrorMsg> create(int n)
    {
      if (n > 20)
      {
        return ErrorMsg{"Too big!"};
      }

      return Foo(n);
    }